

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

ssize_t __thiscall
LinkedReadsDatastore::write(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  ofstream *unaff_retaddr;
  LinkedReadsDatastore *v;
  
  v = this;
  sdglib::write_string(unaff_retaddr,&this->filename);
  sdglib::write_string(unaff_retaddr,&v->filename);
  sVar1 = LinkedReadsMapper::write(&this->mapper,__fd,__buf_00,__n);
  return sVar1;
}

Assistant:

void LinkedReadsDatastore::write(std::ofstream &output_file) {
    //read filename
    sdglib::write_string(output_file, filename);
    sdglib::write_string(output_file, name);

    mapper.write(output_file);
}